

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_slots.cpp
# Opt level: O0

Am_Slot_Key Am_Register_Slot_Name(char *string)

{
  int iVar1;
  int prev_key;
  char *string_local;
  
  verify_slot_name_key_table();
  iVar1 = Am_Symbol_Table::Get_Value(Am_Slot_Name_Key_Table,string);
  if (iVar1 == -1) {
    Am_Symbol_Table::Add_Item
              (Am_Slot_Name_Key_Table,(uint)Am_Register_Slot_Name::current_name,string);
    if (Am_Register_Slot_Name::current_name + 1 < 30000) {
      Am_Error("** Am_Register_Slot_Name: too many slot names registered!\n");
    }
    string_local._6_2_ = Am_Register_Slot_Name::current_name;
    Am_Register_Slot_Name::current_name = Am_Register_Slot_Name::current_name + 1;
  }
  else {
    string_local._6_2_ = (Am_Slot_Key)iVar1;
  }
  return string_local._6_2_;
}

Assistant:

Am_Slot_Key
Am_Register_Slot_Name(const char *string)
{
  // current_name stores the next slot key to allocate
  static Am_Slot_Key current_name = SLOT_NAME_START;

  // do we already have a symbol-table?
  verify_slot_name_key_table();

  int prev_key = Am_Slot_Name_Key_Table->Get_Value(string);
  if (prev_key == -1) {
    Am_Slot_Name_Key_Table->Add_Item(current_name, string);

    // do we have an overflow?
    if (current_name + 1 < SLOT_NAME_START) {
      Am_Error("** Am_Register_Slot_Name: too many slot names registered!\n");
    }

    return (current_name++);
  } else {
    return ((Am_Slot_Key)prev_key);
  }
}